

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimAngular::CreateFromPoints
          (ON_OBSOLETE_V5_DimAngular *this,ON_3dPoint *pc,ON_3dPoint *p0in,ON_3dPoint *p1in,
          ON_3dPoint *arcpt,ON_3dVector *Normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  ON_3dPoint p_02;
  ON_3dPoint p_03;
  undefined1 c [8];
  double s;
  bool bVar7;
  ON_3dVector *pOVar8;
  byte local_2e5;
  ON_2dVector local_2a8;
  ON_2dVector local_298;
  double local_288;
  double os;
  ON_AngularDimension2Extra *pDE;
  ON_2dVector local_268;
  double local_258;
  double dStack_250;
  double local_248;
  double local_238;
  double dStack_230;
  double local_228;
  double local_218;
  double dStack_210;
  double local_208;
  ON_2dVector local_1f8;
  ON_2dVector local_1e8;
  double local_1d8;
  double aa;
  double a1;
  double dStack_1c0;
  double local_1b8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double local_188;
  double dStack_180;
  double local_178;
  undefined1 local_168 [8];
  ON_2dVector v0;
  undefined1 local_128 [8];
  ON_2dPoint pp1;
  ON_2dPoint pp0;
  ON_2dPoint pa;
  ON_Plane plane;
  ON_3dPoint p1;
  ON_3dPoint p0;
  ON_3dVector *Normal_local;
  ON_3dPoint *arcpt_local;
  ON_3dPoint *p1in_local;
  ON_3dPoint *p0in_local;
  ON_3dPoint *pc_local;
  ON_OBSOLETE_V5_DimAngular *this_local;
  
  dVar1 = p0in->z;
  dVar3 = p0in->x;
  dVar4 = p0in->y;
  p_02 = *p0in;
  p_03 = *p0in;
  p = *p0in;
  dVar2 = p1in->z;
  dVar5 = p1in->x;
  dVar6 = p1in->y;
  p_01 = *p1in;
  p_00 = *p1in;
  ON_Plane::ON_Plane((ON_Plane *)&pa.y,pc,Normal);
  bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,p,&pp1.y,&pp0.x);
  if (bVar7) {
    ON_2dVector::ON_2dVector((ON_2dVector *)local_168,(ON_2dPoint *)&pp1.y);
    ON_2dVector::Unitize((ON_2dVector *)local_168);
    bVar7 = ON_2dVector::IsValid((ON_2dVector *)local_168);
    if ((bVar7) &&
       (bVar7 = ON_2dVector::IsNotZero((ON_2dVector *)local_168), s = v0.x, c = local_168, bVar7)) {
      pOVar8 = ON_Plane::Normal((ON_Plane *)&pa.y);
      ON_Plane::Rotate((ON_Plane *)&pa.y,s,(double)c,pOVar8);
    }
    local_188 = dVar3;
    dStack_180 = dVar4;
    local_178 = dVar1;
    bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,p_03,&pp1.y,&pp0.x);
    if (bVar7) {
      local_198 = arcpt->z;
      local_1a8 = arcpt->x;
      dStack_1a0 = arcpt->y;
      bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,*arcpt,&pp0.y,&pa.x);
      if (bVar7) {
        a1 = dVar5;
        dStack_1c0 = dVar6;
        local_1b8 = dVar2;
        bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,p_00,(double *)local_128,&pp1.x);
        if (bVar7) {
          aa = ON_DBL_QNAN;
          local_1d8 = ON_DBL_QNAN;
          ON_2dVector::ON_2dVector(&local_1e8,(ON_2dPoint *)local_128);
          bVar7 = VectorAngle(&local_1e8,&aa);
          local_2e5 = 1;
          if (bVar7) {
            ON_2dVector::ON_2dVector(&local_1f8,(ON_2dPoint *)&pp0.y);
            bVar7 = VectorAngle(&local_1f8,&local_1d8);
            local_2e5 = bVar7 ^ 0xff;
          }
          if ((local_2e5 & 1) == 0) {
            if (aa < local_1d8) {
              ON_2dVector::Set((ON_2dVector *)local_168,(double)local_128,pp1.x);
              ON_2dVector::Unitize((ON_2dVector *)local_168);
              pOVar8 = ON_Plane::Normal((ON_Plane *)&pa.y);
              ON_Plane::Rotate((ON_Plane *)&pa.y,v0.x,(double)local_168,pOVar8);
              local_208 = arcpt->z;
              local_218 = arcpt->x;
              dStack_210 = arcpt->y;
              bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,*arcpt,&pp0.y,&pa.x);
              if (!bVar7) {
                this_local._7_1_ = false;
                goto LAB_006735c8;
              }
              local_238 = dVar5;
              dStack_230 = dVar6;
              local_228 = dVar2;
              bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,p_01,&pp1.y,&pp0.x);
              if (!bVar7) {
                this_local._7_1_ = false;
                goto LAB_006735c8;
              }
              local_258 = dVar3;
              dStack_250 = dVar4;
              local_248 = dVar1;
              bVar7 = ON_Plane::ClosestPointTo((ON_Plane *)&pa.y,p_02,(double *)local_128,&pp1.x);
              if (!bVar7) {
                this_local._7_1_ = false;
                goto LAB_006735c8;
              }
            }
            ON_2dVector::ON_2dVector(&local_268,(ON_2dPoint *)local_128);
            VectorAngle(&local_268,&aa);
            SetAngle(this,aa);
            ON_2dVector::ON_2dVector((ON_2dVector *)&pDE,(ON_2dPoint *)&pp0.y);
            dVar1 = ON_2dVector::Length((ON_2dVector *)&pDE);
            SetRadius(this,dVar1);
            os = (double)ON_AngularDimension2Extra::AngularDimensionExtra(this);
            if ((ON_AngularDimension2Extra *)os != (ON_AngularDimension2Extra *)0x0) {
              ON_2dVector::ON_2dVector(&local_298,(ON_2dPoint *)&pp1.y);
              local_288 = ON_2dVector::Length(&local_298);
              ON_AngularDimension2Extra::SetDimpointOffset
                        ((ON_AngularDimension2Extra *)os,0,local_288);
              ON_2dVector::ON_2dVector(&local_2a8,(ON_2dPoint *)local_128);
              local_288 = ON_2dVector::Length(&local_2a8);
              ON_AngularDimension2Extra::SetDimpointOffset
                        ((ON_AngularDimension2Extra *)os,1,local_288);
            }
            ON_OBSOLETE_V5_Annotation::ReservePoints(&this->super_ON_OBSOLETE_V5_Annotation,4);
            ON_OBSOLETE_V5_Annotation::SetPlane
                      (&this->super_ON_OBSOLETE_V5_Annotation,(ON_Plane *)&pa.y);
            ON_OBSOLETE_V5_Annotation::SetPoint
                      (&this->super_ON_OBSOLETE_V5_Annotation,1,(ON_2dPoint *)&pp1.y);
            ON_OBSOLETE_V5_Annotation::SetPoint
                      (&this->super_ON_OBSOLETE_V5_Annotation,2,(ON_2dPoint *)local_128);
            ON_OBSOLETE_V5_Annotation::SetPoint
                      (&this->super_ON_OBSOLETE_V5_Annotation,3,(ON_2dPoint *)&pp0.y);
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_006735c8:
  v0.y._0_4_ = 1;
  ON_Plane::~ON_Plane((ON_Plane *)&pa.y);
  return this_local._7_1_;
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::CreateFromPoints( 
            const ON_3dPoint& pc, 
            const ON_3dPoint& p0in,
            const ON_3dPoint& p1in,
            ON_3dPoint& arcpt, 
            ON_3dVector& Normal)
{
  ON_3dPoint p0, p1;
  p0 = p0in;
  p1 = p1in;

  ON_Plane plane( pc, Normal);

  ON_2dPoint pa, pp0, pp1;

  if( !plane.ClosestPointTo( p0, &pp0.x, &pp0.y))
    return false;

  // rotate so that p0 is on x-axis
  ON_2dVector v0( pp0);
  v0.Unitize();
  if ( v0.IsValid() && v0.IsNotZero() )
    plane.Rotate( v0.y, v0.x, plane.Normal());

  if( !plane.ClosestPointTo( p0, &pp0.x, &pp0.y))
    return false;

  if( !plane.ClosestPointTo( arcpt, &pa.x, &pa.y))
    return false;

  if( !plane.ClosestPointTo( p1, &pp1.x, &pp1.y))
    return false;

  double a1 = ON_DBL_QNAN;
  double aa = ON_DBL_QNAN;
  if( !VectorAngle( ON_2dVector( pp1), a1) || !VectorAngle( ON_2dVector( pa), aa))    
    return false;

  if( aa > a1)  // the angle is really the bigger one ( > 180)
  {
    // rotate so that p0 is on x-axis
    v0.Set( pp1.x, pp1.y);
    v0.Unitize();
    plane.Rotate( v0.y, v0.x, plane.Normal());

    if( !plane.ClosestPointTo( arcpt, &pa.x, &pa.y))
      return false;
    if( !plane.ClosestPointTo( p1, &pp0.x, &pp0.y))
      return false;
    if( !plane.ClosestPointTo( p0, &pp1.x, &pp1.y))
      return false;
  }

  VectorAngle( ON_2dVector( pp1), a1);

  SetAngle( a1);
  SetRadius( ON_2dVector( pa).Length());

  ON_AngularDimension2Extra* pDE = ON_AngularDimension2Extra::AngularDimensionExtra(this);
  if(pDE != 0)
  {
    double os = ((ON_2dVector)pp0).Length();
    pDE->SetDimpointOffset(0, os);
    os = ((ON_2dVector)pp1).Length();
    pDE->SetDimpointOffset(1, os);
  }

  ReservePoints( 4);
  SetPlane( plane);
  SetPoint( 1, pp0);
  SetPoint( 2, pp1);
  SetPoint( 3, pa);


  return true;
}